

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_1ba5289::ParsePubkeyInner
            (uint32_t key_exp_index,Span<const_char> *sp,ParseScriptContext ctx,
            FlatSigningProvider *out,bool *apostrophe,string *error)

{
  Span<const_unsigned_char> _vch;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  string_view str_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  string_view hex_str;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *out_00;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *split_00;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  uint in_ECX;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_RDI;
  long in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>,_bool> pVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  bool permit_uncompressed;
  iterator __end1;
  iterator __begin1;
  DeriveType type;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  paths;
  CKey key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> split;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ret;
  CExtPubKey extpubkey;
  CExtKey extkey;
  CPubKey pubkey_1;
  uchar fullkey [33];
  CPubKey pubkey;
  string str;
  CExtKey *in_stack_fffffffffffffa78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffa80;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  _Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  undefined6 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  undefined7 in_stack_fffffffffffffaa8;
  char in_stack_fffffffffffffaaf;
  uint *in_stack_fffffffffffffab0;
  reference in_stack_fffffffffffffac8;
  undefined6 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 in_stack_fffffffffffffad7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  CExtPubKey *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  string *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb3f;
  string *error_00;
  bool *apostrophe_00;
  bool local_481;
  Span<const_char> local_3c8 [2];
  Span<const_char> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  Span<const_char> local_368;
  undefined4 local_354;
  undefined1 local_331;
  undefined1 local_311;
  undefined1 local_301;
  allocator<char> local_2c9;
  string local_2c8;
  _Base_ptr local_290;
  undefined1 local_288;
  _Base_ptr local_280;
  undefined1 local_278;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  undefined8 uStack_244;
  undefined8 local_23c;
  undefined8 uStack_234;
  undefined8 local_22c;
  undefined8 uStack_224;
  undefined8 local_21c;
  undefined8 uStack_214;
  undefined8 local_20c;
  undefined8 uStack_204;
  undefined8 local_1fc;
  undefined8 uStack_1f4;
  undefined1 local_1ec;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            *)in_stack_fffffffffffffa78);
  local_481 = in_ECX < 2;
  util::Split<Span<char_const>>
            ((Span<const_char> *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
             in_stack_fffffffffffffaaf);
  apostrophe_00 = (bool *)0x0;
  error_00 = &local_2c8;
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
             (size_type)in_stack_fffffffffffffa80);
  out_00 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffa78);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
             (size_type)in_stack_fffffffffffffa80);
  split_00 = (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (char *)in_stack_fffffffffffffa98,(allocator<char> *)in_stack_fffffffffffffa90._M_node)
  ;
  std::allocator<char>::~allocator(&local_2c9);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78);
  if (sVar4 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    memset(in_RDI,0,0x18);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              *)in_stack_fffffffffffffa78);
    goto LAB_00e77dac;
  }
  sVar5 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     in_stack_fffffffffffffa78);
  if (sVar5 == 1) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa98);
    str_00._M_len._6_1_ = in_stack_fffffffffffffaa6;
    str_00._M_len._0_6_ = in_stack_fffffffffffffaa0;
    str_00._M_len._7_1_ = in_stack_fffffffffffffaa7;
    str_00._M_str._0_7_ = in_stack_fffffffffffffaa8;
    str_00._M_str._7_1_ = in_stack_fffffffffffffaaf;
    in_stack_fffffffffffffb3f = IsHex(str_00);
    if ((bool)in_stack_fffffffffffffb3f) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa98);
      hex_str._M_str._0_7_ = in_stack_fffffffffffffae8;
      hex_str._M_len = (size_t)in_stack_fffffffffffffae0;
      hex_str._M_str._7_1_ = in_stack_fffffffffffffaef;
      ParseHex<unsigned_char>(hex_str);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa78);
      _vch.m_size = (size_t)in_stack_fffffffffffffa98;
      _vch.m_data = (uchar *)in_stack_fffffffffffffa90._M_node;
      CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),_vch
                      );
      bVar1 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffa78);
      if ((!bVar1) ||
         (bVar1 = CPubKey::IsValidNonHybrid
                            ((CPubKey *)
                             CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88)), bVar1))
      {
        bVar1 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffffa90._M_node);
        if (bVar1) {
          if ((local_481) ||
             (bVar1 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffa78), bVar1)) {
            local_301 = 0;
            std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                      (in_stack_fffffffffffffab0,
                       (CPubKey *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                       (bool *)CONCAT17(in_stack_fffffffffffffaa7,
                                        CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0
                                                )));
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
            ::
            emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                      ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)in_stack_fffffffffffffa98,
                       (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                        *)in_stack_fffffffffffffa90._M_node);
            std::
            unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                           *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)in_stack_fffffffffffffa78,
                     (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)0xe7725e);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                      (char *)in_stack_fffffffffffffa80);
            memset(in_RDI,0,0x18);
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)in_stack_fffffffffffffa78);
          }
        }
        else {
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffa78);
          if ((sVar5 == 0x20) && (in_ECX == 4)) {
            local_88 = 0;
            uStack_80 = 0;
            uStack_90 = 0;
            local_78 = 0;
            local_98 = 2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffa80);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffa80);
            __first._M_current._7_1_ = in_stack_fffffffffffffaaf;
            __first._M_current._0_7_ = in_stack_fffffffffffffaa8;
            __last._M_current._6_1_ = in_stack_fffffffffffffaa6;
            __last._M_current._0_6_ = in_stack_fffffffffffffaa0;
            __last._M_current._7_1_ = in_stack_fffffffffffffaa7;
            std::
            copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                      (__first,__last,
                       (uchar *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
            std::begin<unsigned_char,33ul>(&in_stack_fffffffffffffa78->nDepth);
            std::end<unsigned_char,33ul>(&in_stack_fffffffffffffa78->nDepth);
            CPubKey::Set<unsigned_char*>
                      ((CPubKey *)in_stack_fffffffffffffa98,
                       (uchar *)in_stack_fffffffffffffa90._M_node,
                       (uchar *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
            bVar1 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffffa90._M_node);
            if (bVar1) {
              local_311 = 1;
              std::
              make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                        (in_stack_fffffffffffffab0,
                         (CPubKey *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                         (bool *)CONCAT17(in_stack_fffffffffffffaa7,
                                          CONCAT16(in_stack_fffffffffffffaa6,
                                                   in_stack_fffffffffffffaa0)));
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          *)in_stack_fffffffffffffa98,
                         (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                          *)in_stack_fffffffffffffa90._M_node);
              std::
              unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
              ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                             *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)in_stack_fffffffffffffa78,
                       (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)0xe7744a);
              goto LAB_00e774f4;
            }
          }
          tinyformat::format<std::__cxx11::string>
                    ((char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffad8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffad7,
                              CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa78);
          memset(in_RDI,0,0x18);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)in_stack_fffffffffffffa78);
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                   (char *)in_stack_fffffffffffffa80);
        memset(in_RDI,0,0x18);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)in_stack_fffffffffffffa78);
      }
LAB_00e774f4:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
      goto LAB_00e77dac;
    }
    DecodeSecret(in_stack_fffffffffffffb30);
    bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffffa78);
    if (bVar1) {
      if ((local_481) || (bVar1 = CKey::IsCompressed((CKey *)in_stack_fffffffffffffa78), bVar1)) {
        CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffffaa7,
                                         CONCAT16(in_stack_fffffffffffffaa6,
                                                  in_stack_fffffffffffffaa0)));
        CPubKey::GetID((CPubKey *)
                       CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
        pVar7 = std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                ::emplace<CKeyID,CKey&>
                          ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                            *)in_stack_fffffffffffffa98,(CKeyID *)in_stack_fffffffffffffa90._M_node,
                           (CKey *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        local_280 = (_Base_ptr)pVar7.first._M_node;
        local_278 = pVar7.second;
        local_331 = in_ECX == 4;
        std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                  (in_stack_fffffffffffffab0,
                   (CPubKey *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                   (bool *)CONCAT17(in_stack_fffffffffffffaa7,
                                    CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)in_stack_fffffffffffffa98,
                   (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    *)in_stack_fffffffffffffa90._M_node);
        std::
        unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                       *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)in_stack_fffffffffffffa78,
                 (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)0xe77687);
        bVar1 = true;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                   (char *)in_stack_fffffffffffffa80);
        memset(in_RDI,0,0x18);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)in_stack_fffffffffffffa78);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    CKey::~CKey((CKey *)in_stack_fffffffffffffa78);
    if (bVar1) goto LAB_00e77dac;
  }
  DecodeExtKey(in_stack_fffffffffffffaf8);
  DecodeExtPubKey(in_stack_fffffffffffffaf0);
  bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffffa78);
  if ((bVar1) || (bVar1 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffa78), bVar1)) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)in_stack_fffffffffffffa78);
    local_354 = 0;
    pvVar6 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::back
                       ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                        in_stack_fffffffffffffa78);
    Span<const_char>::Span<2>((Span<const_char> *)in_stack_fffffffffffffa78,(char (*) [2])0xe778ac);
    local_368 = Span<const_char>::first
                          ((Span<const_char> *)
                           CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                           (size_t)in_stack_fffffffffffffa80);
    bVar1 = std::ranges::__equal_fn::
            operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,pvVar6,&local_368);
    if (bVar1) {
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::pop_back
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffffa78);
      local_354 = 1;
    }
    else {
      in_stack_fffffffffffffae0 =
           (CExtPubKey *)
           std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::back
                     ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                      in_stack_fffffffffffffa78);
      in_stack_fffffffffffffad8 = &local_398;
      Span<const_char>::Span<3>
                ((Span<const_char> *)in_stack_fffffffffffffa78,(char (*) [3])0xe77962);
      local_398.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )Span<const_char>::first
                       ((Span<const_char> *)
                        CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                        (size_t)in_stack_fffffffffffffa80);
      in_stack_fffffffffffffaef =
           std::ranges::__equal_fn::
           operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                     ((__equal_fn *)&std::ranges::equal,in_stack_fffffffffffffae0,&local_398.field_2
                     );
      in_stack_fffffffffffffad7 = true;
      if (!(bool)in_stack_fffffffffffffaef) {
        in_stack_fffffffffffffac8 =
             std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::back
                       ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                        in_stack_fffffffffffffa78);
        Span<const_char>::Span<3>
                  ((Span<const_char> *)in_stack_fffffffffffffa78,(char (*) [3])0xe779dc);
        local_3a8 = Span<const_char>::first
                              ((Span<const_char> *)
                               CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                               (size_t)in_stack_fffffffffffffa80);
        in_stack_fffffffffffffad6 =
             std::ranges::__equal_fn::
             operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                       ((__equal_fn *)&std::ranges::equal,in_stack_fffffffffffffac8,&local_3a8);
        in_stack_fffffffffffffad7 = in_stack_fffffffffffffad6;
      }
      if ((bool)in_stack_fffffffffffffad7 != false) {
        pvVar6 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::back
                           ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                            in_stack_fffffffffffffa78);
        Span<const_char>::Span<3>
                  ((Span<const_char> *)in_stack_fffffffffffffa78,(char (*) [3])0xe77a5c);
        local_3c8[0] = Span<const_char>::first
                                 ((Span<const_char> *)
                                  CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                                  (size_t)in_stack_fffffffffffffa80);
        bVar1 = std::ranges::__equal_fn::
                operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                          ((__equal_fn *)&std::ranges::equal,pvVar6,local_3c8);
        *(bool *)in_R9 = bVar1;
        std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::pop_back
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                   in_stack_fffffffffffffa78);
        local_354 = 2;
      }
    }
    uVar2 = ParseKeyPath(split_00,out_00,apostrophe_00,error_00,(bool)in_stack_fffffffffffffb3f);
    if ((bool)uVar2) {
      uVar3 = CKey::IsValid((CKey *)in_stack_fffffffffffffa78);
      if ((bool)uVar3) {
        CExtKey::Neuter((CExtKey *)in_stack_fffffffffffffa90._M_node);
        local_158 = local_1ec;
        local_168 = local_1fc;
        uStack_160 = uStack_1f4;
        local_178 = local_20c;
        uStack_170 = uStack_204;
        local_188 = local_21c;
        uStack_180 = uStack_214;
        local_198 = local_22c;
        uStack_190 = uStack_224;
        local_1a8 = local_23c;
        uStack_1a0 = uStack_234;
        local_1b8 = local_24c;
        uStack_1b0 = uStack_244;
        local_1c8 = local_25c;
        uStack_1c0 = uStack_254;
        in_stack_fffffffffffffa98 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_R8 + 0x98);
        CPubKey::GetID((CPubKey *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffaa0)));
        pVar7 = std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                ::emplace<CKeyID,CKey&>
                          ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                            *)in_stack_fffffffffffffa98,(CKeyID *)in_stack_fffffffffffffa90._M_node,
                           (CKey *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        in_stack_fffffffffffffa90 = pVar7.first._M_node;
        in_stack_fffffffffffffa8f = pVar7.second;
        local_290 = in_stack_fffffffffffffa90._M_node;
        local_288 = in_stack_fffffffffffffa8f;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::begin(in_stack_fffffffffffffa80);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end(in_stack_fffffffffffffa80);
      while (bVar1 = __gnu_cxx::
                     operator==<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                               ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                                (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                 *)in_stack_fffffffffffffa80), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::operator*((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     *)in_stack_fffffffffffffa78);
        std::
        make_unique<(anonymous_namespace)::BIP32PubkeyProvider,unsigned_int&,CExtPubKey&,std::vector<unsigned_int,std::allocator<unsigned_int>>,(anonymous_namespace)::DeriveType&,bool&>
                  ((uint *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                   in_stack_fffffffffffffae0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffad8,
                   (DeriveType *)
                   CONCAT17(in_stack_fffffffffffffad7,
                            CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)),
                   (bool *)in_stack_fffffffffffffac8);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)in_stack_fffffffffffffa98,
                   (unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                    *)in_stack_fffffffffffffa90._M_node);
        std::
        unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                       *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      *)in_stack_fffffffffffffa78);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)in_stack_fffffffffffffa78,
               (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)0xe77d65);
    }
    else {
      memset(in_RDI,0,0x18);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)in_stack_fffffffffffffa78);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
  }
  else {
    tinyformat::format<std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffaa7,
                        CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffad8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffad7,
                        CONCAT16(in_stack_fffffffffffffad6,in_stack_fffffffffffffad0)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa78);
    memset(in_RDI,0,0x18);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              *)in_stack_fffffffffffffa78);
  }
  CExtKey::~CExtKey(in_stack_fffffffffffffa78);
LAB_00e77dac:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa78);
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkeyInner(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, bool& apostrophe, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    bool permit_uncompressed = ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH;
    auto split = Split(sp, '/');
    std::string str(split[0].begin(), split[0].end());
    if (str.size() == 0) {
        error = "No key provided";
        return {};
    }
    if (split.size() == 1) {
        if (IsHex(str)) {
            std::vector<unsigned char> data = ParseHex(str);
            CPubKey pubkey(data);
            if (pubkey.IsValid() && !pubkey.IsValidNonHybrid()) {
                error = "Hybrid public keys are not allowed";
                return {};
            }
            if (pubkey.IsFullyValid()) {
                if (permit_uncompressed || pubkey.IsCompressed()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, false));
                    return ret;
                } else {
                    error = "Uncompressed keys are not allowed";
                    return {};
                }
            } else if (data.size() == 32 && ctx == ParseScriptContext::P2TR) {
                unsigned char fullkey[33] = {0x02};
                std::copy(data.begin(), data.end(), fullkey + 1);
                pubkey.Set(std::begin(fullkey), std::end(fullkey));
                if (pubkey.IsFullyValid()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, true));
                    return ret;
                }
            }
            error = strprintf("Pubkey '%s' is invalid", str);
            return {};
        }
        CKey key = DecodeSecret(str);
        if (key.IsValid()) {
            if (permit_uncompressed || key.IsCompressed()) {
                CPubKey pubkey = key.GetPubKey();
                out.keys.emplace(pubkey.GetID(), key);
                ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, ctx == ParseScriptContext::P2TR));
                return ret;
            } else {
                error = "Uncompressed keys are not allowed";
                return {};
            }
        }
    }
    CExtKey extkey = DecodeExtKey(str);
    CExtPubKey extpubkey = DecodeExtPubKey(str);
    if (!extkey.key.IsValid() && !extpubkey.pubkey.IsValid()) {
        error = strprintf("key '%s' is not valid", str);
        return {};
    }
    std::vector<KeyPath> paths;
    DeriveType type = DeriveType::NO;
    if (std::ranges::equal(split.back(), Span{"*"}.first(1))) {
        split.pop_back();
        type = DeriveType::UNHARDENED;
    } else if (std::ranges::equal(split.back(), Span{"*'"}.first(2)) || std::ranges::equal(split.back(), Span{"*h"}.first(2))) {
        apostrophe = std::ranges::equal(split.back(), Span{"*'"}.first(2));
        split.pop_back();
        type = DeriveType::HARDENED;
    }
    if (!ParseKeyPath(split, paths, apostrophe, error, /*allow_multipath=*/true)) return {};
    if (extkey.key.IsValid()) {
        extpubkey = extkey.Neuter();
        out.keys.emplace(extpubkey.pubkey.GetID(), extkey.key);
    }
    for (auto& path : paths) {
        ret.emplace_back(std::make_unique<BIP32PubkeyProvider>(key_exp_index, extpubkey, std::move(path), type, apostrophe));
    }
    return ret;
}